

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O1

void __thiscall axl::g::Module::Module(Module *this)

{
  size_t sVar1;
  
  sys::psx::Mutex::Mutex(&(this->m_finalizerListLock).m_mutex,1);
  (this->m_finalizerList).
  super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  .
  super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  .super_ListData<axl::g::Module::FinalizerEntry>.m_head = (FinalizerEntry *)0x0;
  (this->m_finalizerList).
  super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  .
  super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  .super_ListData<axl::g::Module::FinalizerEntry>.m_tail = (FinalizerEntry *)0x0;
  (this->m_finalizerList).
  super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  .
  super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  .super_ListData<axl::g::Module::FinalizerEntry>.m_count = 0;
  sVar1 = sysconf(0x54);
  (this->m_systemInfo).m_processorCount = sVar1;
  sVar1 = sysconf(0x1e);
  (this->m_systemInfo).m_pageSize = sVar1;
  sVar1 = sysconf(0x1e);
  (this->m_systemInfo).m_mappingAlignFactor = sVar1;
  sys::initPreciseTimestamps();
  return;
}

Assistant:

Module::Module() {
#if (_AXL_OS_WIN)
	_CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);

	m_hModule = ::GetModuleHandle(NULL);

	SYSTEM_INFO systemInfo;
	::GetSystemInfo(&systemInfo);
	m_systemInfo.m_processorCount     = systemInfo.dwNumberOfProcessors;
	m_systemInfo.m_pageSize           = systemInfo.dwPageSize;
	m_systemInfo.m_mappingAlignFactor = systemInfo.dwAllocationGranularity;

	sys::win::initNtDllFunctions();
#elif (_AXL_OS_POSIX)
	m_systemInfo.m_processorCount     = sysconf(_SC_NPROCESSORS_ONLN);
	m_systemInfo.m_pageSize           = sysconf(_SC_PAGE_SIZE);
	m_systemInfo.m_mappingAlignFactor = sysconf(_SC_PAGE_SIZE);
#endif

	sys::initPreciseTimestamps();
}